

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorProto::DescriptorProto(DescriptorProto *this,DescriptorProto *from)

{
  InternalMetadata *this_00;
  void *pvVar1;
  bool bVar2;
  MessageOptions *this_01;
  Arena *arena;
  
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DescriptorProto_003e0268;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField
            (&this->field_,&from->field_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::RepeatedPtrField
            (&this->nested_type_,&from->nested_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::RepeatedPtrField
            (&this->enum_type_,&from->enum_type_);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::RepeatedPtrField
            (&this->extension_range_,&from->extension_range_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField
            (&this->extension_,&from->extension_);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::RepeatedPtrField
            (&this->oneof_decl_,&from->oneof_decl_);
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::RepeatedPtrField
            (&this->reserved_range_,&from->reserved_range_);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->reserved_name_,&from->reserved_name_);
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pvVar1 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (this_00,(UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8));
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    arena = (Arena *)this_00->ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set
              (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->name_).ptr_,arena);
  }
  bVar2 = _internal_has_options(from);
  if (bVar2) {
    this_01 = (MessageOptions *)operator_new(0x50);
    MessageOptions::MessageOptions(this_01,from->options_);
  }
  else {
    this_01 = (MessageOptions *)0x0;
  }
  this->options_ = this_01;
  return;
}

Assistant:

DescriptorProto::DescriptorProto(const DescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_),
      field_(from.field_),
      nested_type_(from.nested_type_),
      enum_type_(from.enum_type_),
      extension_range_(from.extension_range_),
      extension_(from.extension_),
      oneof_decl_(from.oneof_decl_),
      reserved_range_(from.reserved_range_),
      reserved_name_(from.reserved_name_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArena());
  }
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::MessageOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.DescriptorProto)
}